

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtarga.c
# Opt level: O3

void put_gray_rows(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  memcpy(dinfo[1].start_output,*dinfo->buffer,(ulong)cinfo->output_width);
  fwrite(dinfo[1].start_output,1,(ulong)*(uint *)&dinfo[1].put_pixel_rows,(FILE *)dinfo->output_file
        );
  return;
}

Assistant:

METHODDEF(void)
put_gray_rows(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
              JDIMENSION rows_supplied)
/* used for grayscale OR quantized color output */
{
  tga_dest_ptr dest = (tga_dest_ptr)dinfo;
  register JSAMPROW inptr;
  register char *outptr;

  inptr = dest->pub.buffer[0];
  outptr = dest->iobuffer;
  MEMCOPY(outptr, inptr, cinfo->output_width);
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}